

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O0

void preprocessor_line(dmr_C *C,stream *stream,token **line)

{
  token *start_00;
  token *ptVar1;
  token **local_38;
  token **tp;
  token *next;
  token *start;
  token **line_local;
  stream *stream_local;
  dmr_C *C_local;
  
  start_00 = *line;
  ptVar1 = start_00;
  do {
    local_38 = &ptVar1->next;
    ptVar1 = *local_38;
  } while (((ulong)ptVar1->pos >> 0x14 & 1) == 0);
  *line = ptVar1;
  *local_38 = &dmrC_eof_token_entry_;
  handle_preprocessor_line(C,stream,line,start_00);
  return;
}

Assistant:

static void preprocessor_line(struct dmr_C *C, struct stream *stream, struct token **line)
{
	struct token *start = *line, *next;
	struct token **tp = &start->next;

	for (;;) {
		next = *tp;
		if (next->pos.newline)
			break;
		tp = &next->next;
	}
	*line = next;
	*tp = &dmrC_eof_token_entry_;
	handle_preprocessor_line(C, stream, line, start);
}